

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.h
# Opt level: O3

void __thiscall uWS::HttpContext<false>::free(HttpContext<false> *this,void *__ptr)

{
  pointer pfVar1;
  vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>_>_>
  *this_00;
  
  this_00 = (vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>_>_>
             *)us_socket_context_ext(0,this);
  pfVar1 = this_00[0x4b].
           super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1,(long)this_00[0x4c].
                                 super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar1);
  }
  std::
  vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
  ::~vector((vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
             *)&this_00[0x4a].
                super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pfVar1 = this_00[0x49].
           super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pfVar1 != (pointer)(this_00 + 0x4a)) {
    operator_delete(pfVar1,(((pointer)(this_00 + 0x4a))->erasure_).
                           super_internal_capacity_holder<fu2::capacity_default>.storage_.accessor_.
                           inplace_storage_ + 1);
  }
  std::
  vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>_*)>_>_>_>
  ::~vector((vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>_*)>_>_>_>
             *)&this_00[4].
                super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&this_00[2].
                  super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(this_00 + 1));
  std::
  vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_int)>_>_>_>
  ::~vector(this_00);
  us_socket_context_free(0,this);
  return;
}

Assistant:

void free() {
        /* Destruct socket context data */
        HttpContextData<SSL> *httpContextData = getSocketContextData();
        httpContextData->~HttpContextData<SSL>();

        /* Free the socket context in whole */
        us_socket_context_free(SSL, getSocketContext());
    }